

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O1

bool __thiscall OpenMD::FragmentStamp::addTorsionStamp(FragmentStamp *this,TorsionStamp *torsion)

{
  pointer *pppTVar1;
  iterator __position;
  TorsionStamp *local_8;
  
  __position._M_current =
       (this->torsionStamps_).
       super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->torsionStamps_).
      super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_8 = torsion;
    std::vector<OpenMD::TorsionStamp*,std::allocator<OpenMD::TorsionStamp*>>::
    _M_realloc_insert<OpenMD::TorsionStamp*const&>
              ((vector<OpenMD::TorsionStamp*,std::allocator<OpenMD::TorsionStamp*>> *)
               &this->torsionStamps_,__position,&local_8);
  }
  else {
    *__position._M_current = torsion;
    pppTVar1 = &(this->torsionStamps_).
                super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppTVar1 = *pppTVar1 + 1;
  }
  return true;
}

Assistant:

bool FragmentStamp::addTorsionStamp(TorsionStamp* torsion) {
    torsionStamps_.push_back(torsion);
    return true;
  }